

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O3

void mpr_print_addr_set(avl_tree *set)

{
  char *pcVar1;
  list_entity *plVar2;
  oonf_log_source source;
  list_entity *plVar3;
  netaddr_str buf1;
  
  plVar3 = (set->list_head).next;
  plVar2 = (set->list_head).prev;
  source = LOG_MPR;
  if (plVar3->prev != plVar2) {
    do {
      if ((log_global_mask[source] & 1) != 0) {
        pcVar1 = netaddr_to_prefixstring(&buf1,(netaddr *)&plVar3[-2].prev,false);
        oonf_log(LOG_SEVERITY_DEBUG,source,"src/nhdp/mpr/neighbor-graph.c",0xe1,(void *)0x0,0,"%s",
                 pcVar1);
        plVar2 = (set->list_head).prev;
        source = LOG_MPR;
      }
      plVar3 = plVar3->next;
    } while (plVar3->prev != plVar2);
  }
  return;
}

Assistant:

void
mpr_print_addr_set(struct avl_tree *set) {
  struct addr_node *current_node;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf1;
#endif

  avl_for_each_element(set, current_node, _avl_node) {
    OONF_DEBUG(LOG_MPR, "%s", netaddr_to_string(&buf1, &current_node->addr));
  }
}